

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void __thiscall testing::UnitTest::PopGTestTrace(UnitTest *this)

{
  vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_> *this_00;
  GTestMutexLock local_18;
  MutexLock lock;
  UnitTest *this_local;
  
  lock.mutex_ = (MutexBase *)this;
  internal::GTestMutexLock::GTestMutexLock(&local_18,&(this->mutex_).super_MutexBase);
  this_00 = internal::UnitTestImpl::gtest_trace_stack(this->impl_);
  std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>::pop_back
            (this_00);
  internal::GTestMutexLock::~GTestMutexLock(&local_18);
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(mutex_) {
  internal::MutexLock lock(&mutex_);
  impl_->gtest_trace_stack().pop_back();
}